

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.h
# Opt level: O1

void __thiscall SQCompilation::DeclGroup::addDeclaration(DeclGroup *this,VarDecl *d)

{
  uint uVar1;
  Decl *pDVar2;
  int iVar3;
  VarDecl **__dest;
  ulong uVar4;
  
  uVar1 = (this->_decls)._size;
  if ((this->_decls)._allocated <= uVar1) {
    uVar1 = uVar1 * 2;
    uVar4 = 4;
    if (uVar1 != 0) {
      uVar4 = (ulong)uVar1;
    }
    __dest = (VarDecl **)Arena::allocate((this->_decls)._arena,uVar4 * 8);
    memcpy(__dest,(this->_decls)._vals,(ulong)(this->_decls)._size << 3);
    (this->_decls)._vals = __dest;
    (this->_decls)._allocated = (size_type_conflict)uVar4;
  }
  uVar1 = (this->_decls)._size;
  (this->_decls)._size = uVar1 + 1;
  (this->_decls)._vals[uVar1] = d;
  pDVar2 = &(d->super_ValueDecl).super_Decl;
  iVar3 = (pDVar2->super_Statement).super_Node._coordinates.columnEnd;
  (this->super_Decl).super_Statement.super_Node._coordinates.lineEnd =
       (pDVar2->super_Statement).super_Node._coordinates.lineEnd;
  (this->super_Decl).super_Statement.super_Node._coordinates.columnEnd = iVar3;
  return;
}

Assistant:

void addDeclaration(VarDecl *d) {
      _decls.push_back(d);
      setLineEndPos(d->lineEnd());
      setColumnEndPos(d->columnEnd());
    }